

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_7z.cpp
# Opt level: O0

SRes __thiscall C7zArchive::Extract(C7zArchive *this,UInt32 file_index,char *buffer)

{
  SRes SVar1;
  size_t *unaff_retaddr;
  size_t *in_stack_00000008;
  ISzAlloc *in_stack_00000010;
  ISzAlloc *in_stack_00000018;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  UInt32 *pUStack_30;
  SRes res;
  size_t out_size_processed;
  size_t offset;
  char *buffer_local;
  UInt32 file_index_local;
  C7zArchive *this_local;
  
  SVar1 = SzArEx_Extract((CSzArEx *)CONCAT44(file_index,buffer_local._0_4_),(ILookInStream *)buffer,
                         out_size_processed._4_4_,pUStack_30,
                         (Byte **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (size_t *)this,unaff_retaddr,in_stack_00000008,in_stack_00000010,
                         in_stack_00000018);
  if (SVar1 == 0) {
    memcpy(buffer,this->OutBuffer +
                  CONCAT44(out_size_processed._4_4_,(undefined4)out_size_processed),
           (size_t)pUStack_30);
  }
  return SVar1;
}

Assistant:

SRes Extract(UInt32 file_index, char *buffer)
	{
		size_t offset, out_size_processed;
		SRes res = SzArEx_Extract(&DB, &LookStream.s, file_index,
			&BlockIndex, &OutBuffer, &OutBufferSize,
			&offset, &out_size_processed,
			&g_Alloc, &g_Alloc);
		if (res == SZ_OK)
		{
			memcpy(buffer, OutBuffer + offset, out_size_processed);
		}
		return res;
	}